

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_PtrDumpBoxVerilog(FILE *pFile,Vec_Ptr_t *vBox)

{
  char *pcVar1;
  void *pvVar2;
  void *pvVar3;
  int i;
  
  pvVar2 = Vec_PtrEntry(vBox,0);
  fprintf((FILE *)pFile,"  %s",pvVar2);
  pvVar2 = Vec_PtrEntry(vBox,1);
  fprintf((FILE *)pFile," %s (",pvVar2);
  for (i = 2; i < vBox->nSize; i = i + 2) {
    pvVar2 = Vec_PtrEntry(vBox,i);
    pvVar3 = Vec_PtrEntry(vBox,i + 1);
    pcVar1 = "T = %d\t\t";
    if (i < vBox->nSize + -2) {
      pcVar1 = "    \"%s\", ";
    }
    fprintf((FILE *)pFile,".%s(%s)%s",pvVar2,pvVar3,pcVar1 + 8);
  }
  fwrite(");\n",3,1,(FILE *)pFile);
  return;
}

Assistant:

void Bac_PtrDumpBoxVerilog( FILE * pFile, Vec_Ptr_t * vBox )
{
    char * pName; int i;
    fprintf( pFile, "  %s", (char *)Vec_PtrEntry(vBox, 0) );
    fprintf( pFile, " %s (", (char *)Vec_PtrEntry(vBox, 1) ); // write intance name in Verilog
    Vec_PtrForEachEntryStart( char *, vBox, pName, i, 2 )
        fprintf( pFile, ".%s(%s)%s", pName, (char *)Vec_PtrEntry(vBox, i+1), i < Vec_PtrSize(vBox) - 2 ? ", ":"" ), i++;
    fprintf( pFile, ");\n" );
}